

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_dec_tiledecode(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  byte bVar1;
  uint_fast8_t uVar2;
  jpc_dec_ccp_t *pjVar3;
  jas_matrix_t *pjVar4;
  ulong uVar5;
  long lVar6;
  jpc_dec_tcomp_t *pjVar7;
  jpc_dec_cmpt_t *pjVar8;
  _Bool _Var9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  jas_matind_t i;
  jas_seqent_t *pjVar16;
  int iVar17;
  jpc_dec_band_t *pjVar18;
  ulong uVar19;
  jpc_tsfb_t **ppjVar20;
  long lVar21;
  jpc_dec_tcomp_t *pjVar22;
  char *fmt;
  jpc_dec_cmpt_t *pjVar23;
  jas_matind_t i_1;
  jas_matind_t j_2;
  jas_seqent_t jVar24;
  long lVar25;
  int iVar26;
  jas_matind_t j;
  long lVar27;
  int iVar28;
  jpc_dec_tcomp_t *local_88;
  jpc_dec_rlvl_t *local_80;
  
  iVar10 = jpc_dec_decodecblks(dec,tile);
  if (iVar10 != 0) {
    fmt = "jpc_dec_decodecblks failed\n";
    goto LAB_0011d756;
  }
  local_88 = tile->tcomps;
  for (lVar15 = 0; uVar12 = (ulong)dec->numcomps, lVar15 < (long)uVar12; lVar15 = lVar15 + 1) {
    pjVar3 = tile->cp->ccps;
    local_80 = local_88->rlvls;
    for (uVar13 = 0; uVar13 < local_88->numrlvls; uVar13 = uVar13 + 1) {
      pjVar18 = local_80->bands;
      if (pjVar18 != (jpc_dec_band_t *)0x0) {
        for (iVar10 = 0; iVar10 < local_80->numbands; iVar10 = iVar10 + 1) {
          pjVar4 = pjVar18->data;
          if (pjVar4 != (jas_matrix_t *)0x0) {
            iVar26 = pjVar18->numbps;
            iVar28 = pjVar18->roishift;
            bVar1 = pjVar3[lVar15].roishift;
            iVar17 = iVar28;
            if (iVar28 < 0) {
              iVar17 = 0;
              jas_eprintf(
                         "warning: forcing negative ROI shift to zero (bitstream is probably corrupt)\n"
                         );
            }
            iVar28 = (uint)bVar1 - iVar28;
            if (iVar17 != 0 || iVar28 != 0) {
              bVar1 = (byte)iVar17 & 0x1f;
              uVar12 = -1L << ((byte)iVar26 & 0x3f);
              uVar11 = 0 << bVar1;
              for (lVar25 = 0; lVar25 < pjVar4->numrows_; lVar25 = lVar25 + 1) {
                for (lVar27 = 0; lVar27 < pjVar4->numcols_; lVar27 = lVar27 + 1) {
                  pjVar16 = pjVar4->rows_[lVar25];
                  uVar5 = pjVar16[lVar27];
                  uVar19 = -uVar5;
                  if (0 < (long)uVar5) {
                    uVar19 = uVar5;
                  }
                  if ((long)uVar19 < (long)(1 << bVar1)) {
                    uVar19 = uVar19 << ((byte)iVar28 & 0x3f);
                    if ((uVar19 & uVar12) != 0) {
                      if ((uVar11 & 1) == 0) {
                        jas_eprintf("warning: possibly corrupt code stream\n");
                        pjVar16 = pjVar4->rows_[lVar25];
                      }
                      uVar19 = uVar19 & ~uVar12;
                      uVar11 = 1;
                    }
                  }
                  else {
                    uVar19 = uVar19 >> ((byte)iVar17 & 0x3f);
                  }
                  uVar14 = -uVar19;
                  if (-1 < (long)uVar5) {
                    uVar14 = uVar19;
                  }
                  pjVar16[lVar27] = uVar14;
                }
              }
            }
            if (tile->realmode != 0) {
              jas_matrix_asl(pjVar18->data,0xd);
              lVar25 = pjVar18->absstepsize;
              if (lVar25 < 0) {
                __assert_fail("absstepsize >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                              ,0x797,"void jpc_dequantize(jas_matrix_t *, jpc_fix_t)");
              }
              if (lVar25 != 0x2000) {
                pjVar4 = pjVar18->data;
                for (lVar27 = 0; lVar27 < pjVar4->numrows_; lVar27 = lVar27 + 1) {
                  for (lVar21 = 0; lVar21 < pjVar4->numcols_; lVar21 = lVar21 + 1) {
                    lVar6 = pjVar4->rows_[lVar27][lVar21];
                    jVar24 = lVar6 * lVar25 >> 0xd;
                    if (lVar6 == 0) {
                      jVar24 = 0;
                    }
                    pjVar4->rows_[lVar27][lVar21] = jVar24;
                  }
                }
              }
            }
          }
          pjVar18 = pjVar18 + 1;
        }
      }
      local_80 = local_80 + 1;
    }
    local_88 = local_88 + 1;
  }
  ppjVar20 = &tile->tcomps->tsfb;
  for (iVar10 = 0; iVar26 = (int)uVar12, iVar10 < iVar26; iVar10 = iVar10 + 1) {
    jpc_tsfb_synthesize(*ppjVar20,(jas_seq2d_t *)ppjVar20[-3]);
    uVar12 = (ulong)(uint)dec->numcomps;
    ppjVar20 = ppjVar20 + 8;
  }
  uVar2 = tile->cp->mctid;
  if (uVar2 == '\x01') {
    if (iVar26 < 3) {
      fmt = "ICT requires at least three components\n";
      goto LAB_0011d756;
    }
    _Var9 = jas_image_cmpt_domains_same(dec->image);
    if (!_Var9) {
LAB_0011dc5e:
      fmt = "RCT requires all components have the same domain\n";
      goto LAB_0011d756;
    }
    pjVar7 = tile->tcomps;
    jpc_iict(pjVar7->data,pjVar7[1].data,pjVar7[2].data);
  }
  else if (uVar2 == '\x02') {
    if (iVar26 < 3) {
      fmt = "RCT requires at least three components\n";
      goto LAB_0011d756;
    }
    _Var9 = jas_image_cmpt_domains_same(dec->image);
    if (!_Var9) goto LAB_0011dc5e;
    pjVar7 = tile->tcomps;
    jpc_irct(pjVar7->data,pjVar7[1].data,pjVar7[2].data);
  }
  iVar10 = dec->numcomps;
  iVar28 = 0;
  iVar26 = 0;
  if (0 < iVar10) {
    iVar26 = iVar10;
  }
  pjVar7 = tile->tcomps;
  pjVar22 = pjVar7;
  if (tile->realmode != 0) {
    for (; iVar28 != iVar26; iVar28 = iVar28 + 1) {
      pjVar4 = pjVar22->data;
      for (lVar15 = 0; lVar15 < pjVar4->numrows_; lVar15 = lVar15 + 1) {
        for (lVar25 = 0; lVar25 < pjVar4->numcols_; lVar25 = lVar25 + 1) {
          iVar17 = (int)pjVar4->rows_[lVar15][lVar25];
          if (iVar17 < 0) {
            iVar17 = iVar17 + 0x1000;
          }
          else {
            iVar17 = -(0x1000U - iVar17 & 0xffffe000);
          }
          pjVar4->rows_[lVar15][lVar25] = (long)(iVar17 >> 0xd);
        }
      }
      pjVar22 = pjVar22 + 1;
    }
  }
  pjVar8 = dec->cmpts;
  pjVar23 = pjVar8;
  pjVar22 = pjVar7;
  for (iVar28 = 0; iVar28 != iVar26; iVar28 = iVar28 + 1) {
    if (pjVar23->sgnd == false) {
      lVar15 = (long)(1 << ((char)pjVar23->prec - 1U & 0x1f));
    }
    else {
      lVar15 = 0;
    }
    pjVar4 = pjVar22->data;
    for (lVar25 = 0; lVar25 < pjVar4->numrows_; lVar25 = lVar25 + 1) {
      for (lVar27 = 0; lVar27 < pjVar4->numcols_; lVar27 = lVar27 + 1) {
        pjVar4->rows_[lVar25][lVar27] = pjVar4->rows_[lVar25][lVar27] + lVar15;
      }
    }
    pjVar22 = pjVar22 + 1;
    pjVar23 = pjVar23 + 1;
  }
  lVar15 = 0;
  for (iVar26 = 0; iVar26 < iVar10; iVar26 = iVar26 + 1) {
    bVar1 = *(byte *)((long)&pjVar8->prec + lVar15);
    uVar13 = -1 << (bVar1 - 1 & 0x1f);
    lVar25 = (long)(int)uVar13;
    if ((&pjVar8->sgnd)[lVar15] == false) {
      lVar25 = 0;
      uVar13 = -1 << (bVar1 & 0x1f);
    }
    jas_matrix_clip(*(jas_matrix_t **)((long)&pjVar7->data + lVar15),lVar25,(ulong)~uVar13);
    iVar10 = dec->numcomps;
    lVar15 = lVar15 + 0x40;
  }
  pjVar7 = tile->tcomps;
  pjVar8 = dec->cmpts;
  lVar15 = 0;
  uVar13 = 0;
  while( true ) {
    if (iVar10 <= (int)uVar13) {
      return 0;
    }
    uVar12 = *(ulong *)((long)&pjVar8->hstep + lVar15);
    uVar5 = *(ulong *)((long)&pjVar8->vstep + lVar15);
    pjVar4 = *(jas_matrix_t **)((long)&pjVar7->data + lVar15);
    iVar10 = jas_image_writecmpt(dec->image,uVar13,
                                 *(long *)((long)&pjVar7->xstart + lVar15) -
                                 ((dec->xstart + uVar12) - 1) / uVar12,
                                 *(long *)((long)&pjVar7->ystart + lVar15) -
                                 ((dec->ystart + uVar5) - 1) / uVar5,pjVar4->numcols_,
                                 pjVar4->numrows_,pjVar4);
    if (iVar10 != 0) break;
    uVar13 = uVar13 + 1;
    iVar10 = dec->numcomps;
    lVar15 = lVar15 + 0x40;
  }
  fmt = "write component failed\n";
LAB_0011d756:
  jas_eprintf(fmt);
  return -1;
}

Assistant:

static int jpc_dec_tiledecode(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	jpc_dec_rlvl_t *rlvl;
	jpc_dec_band_t *band;
	int compno;
	unsigned rlvlno;
	int bandno;
	int adjust;
	int v;
	jpc_dec_ccp_t *ccp;
	jpc_dec_cmpt_t *cmpt;

	if (jpc_dec_decodecblks(dec, tile)) {
		jas_eprintf("jpc_dec_decodecblks failed\n");
		return -1;
	}

	/* Perform dequantization. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
		  ++rlvlno, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandno = 0, band = rlvl->bands;
			  bandno < rlvl->numbands; ++bandno, ++band) {
				if (!band->data) {
					continue;
				}
				jpc_undo_roi(band->data, band->roishift, ccp->roishift -
				  band->roishift, band->numbps);
				if (tile->realmode) {
					jas_matrix_asl(band->data, JPC_FIX_FRACBITS);
					jpc_dequantize(band->data, band->absstepsize);
				}

			}
		}
	}

	/* Apply an inverse wavelet transform if necessary. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		jpc_tsfb_synthesize(tcomp->tsfb, tcomp->data);
	}


	/* Apply an inverse intercomponent transform if necessary. */
	switch (tile->cp->mctid) {
	case JPC_MCT_RCT:
		if (dec->numcomps < 3) {
			jas_eprintf("RCT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_irct(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	case JPC_MCT_ICT:
		if (dec->numcomps < 3) {
			jas_eprintf("ICT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_iict(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	}

	/* Perform rounding and convert to integer values. */
	if (tile->realmode) {
		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
				for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
					v = jas_matrix_get(tcomp->data, i, j);
					v = jpc_fix_round(v);
					jas_matrix_set(tcomp->data, i, j, jpc_fixtoint(v));
				}
			}
		}
	}

	/* Perform level shift. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		adjust = cmpt->sgnd ? 0 : (1 << (cmpt->prec - 1));
		for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
			for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
				*jas_matrix_getref(tcomp->data, i, j) += adjust;
			}
		}
	}

	/* Perform clipping. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		jpc_fix_t mn;
		jpc_fix_t mx;
		mn = cmpt->sgnd ? (-(1 << (cmpt->prec - 1))) : (0);
		mx = cmpt->sgnd ? ((1 << (cmpt->prec - 1)) - 1) : ((1 <<
		  cmpt->prec) - 1);
		jas_matrix_clip(tcomp->data, mn, mx);
	}

	/* XXX need to free tsfb struct */

	/* Write the data for each component of the image. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		if (jas_image_writecmpt(dec->image, compno, tcomp->xstart -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep), tcomp->ystart -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep), jas_matrix_numcols(
		  tcomp->data), jas_matrix_numrows(tcomp->data), tcomp->data)) {
			jas_eprintf("write component failed\n");
			return -1;
		}
	}

	return 0;
}